

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_alloc.c
# Opt level: O2

void free_checked(int *ptr)

{
  int *ptr_00;
  char *pcVar1;
  long lVar2;
  undefined8 uStackY_30;
  
  lVar2 = (long)*ptr;
  if ((lVar2 < 1000) && (*(int *)((((long)ptr[1] & 0xfffffffffffffffcU) - 4) + (long)ptr) == *ptr))
  {
    ptr_00 = ptrs[lVar2];
    if (ptr_00 == ptr) {
      *(undefined4 *)((long)ptr_00 + (((long)ptr[1] & 0xfffffffffffffffcU) - 4)) = 0x7fffffff;
      *ptr_00 = 0x7fffffff;
      smfree(&alloc,ptr_00,(long)ptr_00[1]);
      ptrs[lVar2] = (int *)0x0;
      return;
    }
    pcVar1 = "ptrs[pos] == ptr";
    uStackY_30 = 0x1f;
  }
  else {
    pcVar1 = "ptr[0] < OBJECTS_MAX && ptr[ptr[1]/sizeof(int)-1] == ptr[0]";
    uStackY_30 = 0x1d;
  }
  fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",pcVar1,"false",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c",
          uStackY_30,"free_checked");
  exit(-1);
}

Assistant:

static inline void
free_checked(int *ptr)
{
	fail_unless(ptr[0] < OBJECTS_MAX &&
		    ptr[ptr[1]/sizeof(int)-1] == ptr[0]);
	int pos = ptr[0];
	fail_unless(ptrs[pos] == ptr);
	ptrs[pos][0] = ptrs[pos][ptr[1]/sizeof(int)-1] = INT_MAX;
	smfree(&alloc, ptrs[pos], ptrs[pos][1]);
	ptrs[pos] = NULL;
}